

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O0

void ex_Avg(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  int iVar1;
  ex_ex *peVar2;
  t_pd local_70;
  long local_68;
  long n2;
  long n1;
  long indx;
  t_word *ptStack_48;
  t_float sum;
  t_word *wvec;
  _garray *p_Stack_38;
  int size;
  _garray *garray;
  t_symbol *s;
  ex_ex *optr_local;
  ex_ex *argv_local;
  long argc_local;
  t_expr *e_local;
  
  s = (t_symbol *)optr;
  optr_local = argv;
  argv_local = (ex_ex *)argc;
  argc_local = (long)e;
  if (argv->ex_type == 7) {
    garray = (_garray *)(argv->ex_cont).v_vec;
    if (((garray != (_garray *)0x0) &&
        (p_Stack_38 = (_garray *)pd_findbyclass((t_symbol *)garray,garray_class),
        p_Stack_38 != (_garray *)0x0)) &&
       (iVar1 = garray_getfloatwords(p_Stack_38,(int *)((long)&wvec + 4),&stack0xffffffffffffffb8),
       iVar1 != 0)) {
      peVar2 = optr_local + 1;
      if (optr_local[1].ex_type == 1) {
        n2 = (peVar2->ex_cont).v_int;
      }
      else {
        if (optr_local[1].ex_type != 2) {
          optr_local = peVar2;
          post("expr: Avg: boundaries have to be fix values\n");
          s->s_thing = (_class **)&DAT_00000001;
          s->s_name = (char *)0x0;
          return;
        }
        n2 = (long)(peVar2->ex_cont).v_flt;
      }
      if (n2 < 0) {
        n2 = 0;
      }
      peVar2 = optr_local + 2;
      if (optr_local[2].ex_type == 1) {
        local_68 = (peVar2->ex_cont).v_int;
      }
      else {
        if (optr_local[2].ex_type != 2) {
          optr_local = peVar2;
          post("expr: Avg: boundaries have to be fix values\n");
          s->s_thing = (_class **)&DAT_00000001;
          s->s_name = (char *)0x0;
          return;
        }
        local_68 = (long)(peVar2->ex_cont).v_flt;
      }
      if (wvec._4_4_ <= local_68) {
        local_68 = (long)(wvec._4_4_ + -1);
      }
      indx._4_4_ = 0.0;
      for (n1 = n2; n1 <= local_68; n1 = n1 + 1) {
        if ((-1 < n1) && (n1 < wvec._4_4_)) {
          indx._4_4_ = ptStack_48[n1].w_float + indx._4_4_;
        }
      }
      s->s_thing = (_class **)0x2;
      *(float *)&s->s_name = indx._4_4_ / (float)((local_68 - n2) + 1);
      return;
    }
    s->s_thing = (_class **)0x2;
    s->s_name = (char *)0x0;
    if (garray == (_garray *)0x0) {
      local_70 = (t_pd)0x21447e;
    }
    else {
      local_70 = (garray->x_gobj).g_pd;
    }
    pd_error((void *)0x0,"no such table \'%s\'",local_70);
  }
  else {
    post("expr: sum: need a table name\n");
    s->s_thing = (_class **)&DAT_00000001;
    s->s_name = (char *)0x0;
  }
  return;
}

Assistant:

void
ex_Avg(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        t_symbol *s;
        t_garray *garray;
        int size;
        t_word *wvec;
        t_float sum;
        long indx, n1, n2;

        if (argv->ex_type != ET_SYM)
        {
                post("expr: sum: need a table name\n");
                optr->ex_type = ET_INT;
                optr->ex_int = 0;
                return;
        }

        s = (fts_symbol_t ) argv->ex_ptr;

        ISTABLE(s, garray, size, wvec);

                switch((++argv)->ex_type) {
                case ET_INT:
                n1 = argv->ex_int;
                        break;
                case ET_FLT:
                n1 = argv->ex_flt;
                        break;
                default:
                        post("expr: Avg: boundaries have to be fix values\n");
                        optr->ex_type = ET_INT;
                        optr->ex_int = 0;
                        return;
                }
                if (n1 < 0)
                        n1 = 0;

                switch((++argv)->ex_type) {
                case ET_INT:
                n2 = argv->ex_int;
                        break;
                case ET_FLT:
                n2 = argv->ex_flt;
                        break;
                default:
                        post("expr: Avg: boundaries have to be fix values\n");
                        optr->ex_type = ET_INT;
                        optr->ex_int = 0;
                        return;
                }
                if (n2 >= size)
                        n2 = size - 1;

        for (indx = n1, sum = 0; indx <= n2; indx++)
                if (indx >= 0 && indx < size)
                        sum += wvec[indx].w_float;

        optr->ex_type = ET_FLT;
        optr->ex_flt = sum / (n2 - n1 + 1);
}